

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Tracer_testTracerSpanSelfRefWithOtherRefs_Test::TestBody
          (Tracer_testTracerSpanSelfRefWithOtherRefs_Test *this)

{
  uint64_t *puVar1;
  long *plVar2;
  __buckets_ptr pp_Var3;
  size_type this_00;
  char cVar4;
  Span *span;
  SpanContext *pSVar5;
  char *pcVar6;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
  option_list_00;
  AssertionResult gtest_ar__1;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  SpanContext spanSelfContext2;
  SpanContext spanSelfContext;
  Span jaegerSpanRoot;
  long *local_388;
  string local_380;
  TraceID local_360;
  AssertHelper local_350 [8];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_348;
  long *local_310 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  SpanContext local_2f8;
  SpanContext local_248;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_198 [6];
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  this_00 = local_198[0]._M_bucket_count;
  pp_Var3 = local_198[0]._M_buckets;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198[0]._M_bucket_count !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_198[0]._M_bucket_count + 8) =
           *(_Atomic_word *)(local_198[0]._M_bucket_count + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198[0]._M_bucket_count ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00193069;
    }
    else {
      *(_Atomic_word *)(local_198[0]._M_bucket_count + 8) =
           *(_Atomic_word *)(local_198[0]._M_bucket_count + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198[0]._M_bucket_count);
  }
LAB_00193069:
  local_348._M_buckets = (__buckets_ptr)0x1;
  local_348._M_bucket_count = 2;
  local_198[0]._M_buckets = &local_198[0]._M_single_bucket;
  local_198[0]._M_bucket_count = 1;
  local_198[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_198[0]._M_element_count = 0;
  local_198[0]._M_rehash_policy._M_max_load_factor = 1.0;
  local_198[0]._M_rehash_policy._4_4_ = 0;
  local_198[0]._M_rehash_policy._M_next_resize = 0;
  local_198[0]._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = &local_2f8._traceID._low;
  pcVar6 = "";
  local_2f8.super_SpanContext._vptr_SpanContext = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"","");
  SpanContext::SpanContext
            (&local_248,(TraceID *)&local_348,3,0,'\0',(StrMap *)local_198,(string *)&local_2f8);
  if (local_2f8.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
    operator_delete(local_2f8.super_SpanContext._vptr_SpanContext);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_198);
  jaegertracing::SelfRef((SpanContext *)local_198);
  operation_name.length_ = (size_t)"test-root-self-ref";
  operation_name.data_ = (char *)pp_Var3;
  option_list._M_len = (size_type)&local_2f8;
  option_list._M_array = (iterator)0x12;
  local_2f8.super_SpanContext._vptr_SpanContext = (_func_int **)local_198;
  opentracing::v3::Tracer::StartSpan((Tracer *)&local_388,operation_name,option_list);
  local_2f8.super_SpanContext._vptr_SpanContext._0_1_ = local_388 != (long *)0x0;
  local_2f8._traceID._high = 0;
  if (local_388 == (long *)0x0) {
    testing::Message::Message((Message *)&local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_198,(char *)&local_2f8,"spanRoot","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_380,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x21d,(char *)local_198[0]._M_buckets);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
    if ((__node_base *)local_198[0]._M_buckets != &local_198[0]._M_before_begin) {
      operator_delete(local_198[0]._M_buckets);
    }
    if (local_348._M_buckets != (__buckets_ptr)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_348._M_buckets != (__buckets_ptr)0x0)) {
        (*(code *)(*local_348._M_buckets)[1]._M_nxt)();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_2f8._traceID,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_2f8._traceID,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    span = (Span *)__dynamic_cast(local_388,&opentracing::v3::Span::typeinfo,&Span::typeinfo,0);
    if (span == (Span *)0x0) {
      __cxa_bad_cast();
    }
    Span::Span((Span *)local_198,span);
    pSVar5 = Span::context((Span *)local_198);
    local_348._M_buckets = (__buckets_ptr)0x1;
    local_348._M_bucket_count = 2;
    testing::internal::CmpHelperEQ<jaegertracing::TraceID,jaegertracing::TraceID>
              ((internal *)&local_2f8,"jaegerSpanRoot.context().traceID()",
               "jaegertracing::TraceID(1, 2)",&pSVar5->_traceID,(TraceID *)&local_348);
    if ((char)local_2f8.super_SpanContext._vptr_SpanContext == '\0') {
      testing::Message::Message((Message *)&local_348);
      if ((undefined8 *)local_2f8._traceID._high != (undefined8 *)0x0) {
        pcVar6 = *(char **)local_2f8._traceID._high;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_380,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x21f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
      if (local_348._M_buckets != (__buckets_ptr)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && (local_348._M_buckets != (__buckets_ptr)0x0)) {
          (*(code *)(*local_348._M_buckets)[1]._M_nxt)();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_2f8._traceID,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_2f8._traceID,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pSVar5 = Span::context((Span *)local_198);
      local_348._M_buckets = (__buckets_ptr)pSVar5->_spanID;
      local_380._M_dataplus._M_p._0_4_ = 3;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&local_2f8,"jaegerSpanRoot.context().spanID()","3",
                 (unsigned_long *)&local_348,(int *)&local_380);
      if ((char)local_2f8.super_SpanContext._vptr_SpanContext != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_2f8._traceID,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_360._high = 1;
        local_360._low = 2;
        local_348._M_buckets = &local_348._M_single_bucket;
        local_348._M_bucket_count = 1;
        local_348._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_348._M_element_count = 0;
        local_348._M_rehash_policy._M_max_load_factor = 1.0;
        local_348._M_rehash_policy._4_4_ = 0;
        local_348._M_rehash_policy._M_next_resize = 0;
        local_348._M_single_bucket = (__node_base_ptr)0x0;
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"");
        SpanContext::SpanContext(&local_2f8,&local_360,4,0,'\0',(StrMap *)&local_348,&local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_348);
        local_348._M_before_begin._M_nxt = (_Hash_node_base *)(**(code **)(*local_388 + 0x50))();
        local_348._M_buckets = (__buckets_ptr)&PTR__StartSpanOption_0020b2a8;
        local_348._M_bucket_count = CONCAT44(local_348._M_bucket_count._4_4_,1);
        local_360._high = (uint64_t)&local_348;
        jaegertracing::SelfRef((SpanContext *)&local_380);
        operation_name_00.length_ = (size_t)"test-child-self-ref";
        operation_name_00.data_ = (char *)pp_Var3;
        option_list_00._M_len = (size_type)&local_360;
        option_list_00._M_array = (iterator)0x13;
        local_360._low = (uint64_t)&local_380;
        opentracing::v3::Tracer::StartSpan((Tracer *)local_310,operation_name_00,option_list_00);
        plVar2 = local_310[0];
        local_380._M_dataplus._M_p._0_1_ = local_310[0] == (long *)0x0;
        local_380._M_string_length = 0;
        if (local_310[0] != (long *)0x0) {
          testing::Message::Message((Message *)&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&local_348,(char *)&local_380,"spanChild","true");
          testing::internal::AssertHelper::AssertHelper
                    (local_350,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x226,(char *)local_348._M_buckets);
          testing::internal::AssertHelper::operator=(local_350,(Message *)&local_360);
          testing::internal::AssertHelper::~AssertHelper(local_350);
          if ((__node_base *)local_348._M_buckets != &local_348._M_before_begin) {
            operator_delete(local_348._M_buckets);
          }
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_360._high !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)0x0) {
            cVar4 = testing::internal::IsTrue(true);
            if ((cVar4 != '\0') &&
               ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_360._high !=
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)0x0)) {
              (*(code *)(*(__buckets_ptr *)local_360._high)[1])();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_380._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_310[0] != (long *)0x0) {
          (**(code **)(*local_310[0] + 8))();
        }
        local_2f8.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._debugID._M_dataplus._M_p != &local_2f8._debugID.field_2) {
          operator_delete(local_2f8._debugID._M_dataplus._M_p);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_2f8._baggage._M_h);
        Span::~Span((Span *)local_198);
        if (local_388 != (long *)0x0) {
          (**(code **)(*local_388 + 8))();
        }
        local_248.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._debugID._M_dataplus._M_p != &local_248._debugID.field_2) {
          operator_delete(local_248._debugID._M_dataplus._M_p);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_248._baggage._M_h);
        if (plVar2 == (long *)0x0) {
          (*(code *)(*pp_Var3)[0xb]._M_nxt)(pp_Var3);
        }
        goto LAB_001936f8;
      }
      testing::Message::Message((Message *)&local_348);
      if ((undefined8 *)local_2f8._traceID._high == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_2f8._traceID._high;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_380,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x220,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
      if (local_348._M_buckets != (__buckets_ptr)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && (local_348._M_buckets != (__buckets_ptr)0x0)) {
          (*(code *)(*local_348._M_buckets)[1]._M_nxt)();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_2f8._traceID,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    Span::~Span((Span *)local_198);
  }
  if (local_388 != (long *)0x0) {
    (**(code **)(*local_388 + 8))();
  }
  local_248.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._debugID._M_dataplus._M_p != &local_248._debugID.field_2) {
    operator_delete(local_248._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_248._baggage._M_h);
LAB_001936f8:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
  }
  return;
}

Assistant:

TEST(Tracer, testTracerSpanSelfRefWithOtherRefs)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        const jaegertracing::SpanContext spanSelfContext { {1, 2}, 3, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanRoot = tracer->StartSpan("test-root-self-ref", {jaegertracing::SelfRef(&spanSelfContext)});
        ASSERT_TRUE(spanRoot);
        auto jaegerSpanRoot = dynamic_cast<jaegertracing::Span&>(*spanRoot.get());
        ASSERT_EQ(jaegerSpanRoot.context().traceID(), jaegertracing::TraceID(1, 2));
        ASSERT_EQ(jaegerSpanRoot.context().spanID(), 3);

        const jaegertracing::SpanContext spanSelfContext2 { {1, 2}, 4, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanChild = tracer->StartSpan("test-child-self-ref",
            { opentracing::ChildOf(&spanRoot->context()), jaegertracing::SelfRef(&spanSelfContext2) }
        );
        ASSERT_FALSE(spanChild);
    }
    tracer->Close();
}